

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O0

void screen_content_tools_determination
               (AV1_COMP *cpi,int allow_screen_content_tools_orig_decision,
               int allow_intrabc_orig_decision,int use_screen_content_tools_orig_decision,
               int is_screen_content_type_orig_decision,int pass,int *projected_size_pass,
               PSNR_STATS *psnr)

{
  bool bVar1;
  undefined4 in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  undefined4 in_R8D;
  int in_R9D;
  double dVar2;
  double dVar3;
  int is_sc_encoding_much_better;
  int ratio_is_large;
  int psnr_diff_is_large;
  double palette_ratio;
  double psnr_diff;
  uint32_t bit_depth;
  uint32_t in_bit_depth;
  FeatureFlags *features;
  AV1_COMMON *cm;
  undefined4 in_stack_00000038;
  bool local_55;
  
  *(undefined4 *)(_ratio_is_large + (long)in_R9D * 4) = *(undefined4 *)(in_RDI + 0x60778);
  aom_calc_highbd_psnr
            ((YV12_BUFFER_CONFIG *)
             CONCAT44(use_screen_content_tools_orig_decision,is_screen_content_type_orig_decision),
             (YV12_BUFFER_CONFIG *)CONCAT44(pass,in_stack_00000038),(PSNR_STATS *)cm,features._4_4_,
             (uint32_t)features);
  if (in_R9D == 1) {
    dVar2 = *(double *)((long)palette_ratio + 0xa0) - *(double *)palette_ratio;
    dVar3 = (double)*(int *)(in_RDI + 0x9d708) /
            (double)(*(int *)(in_RDI + 0x3bfbc) * *(int *)(in_RDI + 0x3bfb8));
    local_55 = 0.0001 <= dVar3 && 4.0 < dVar2 / dVar3;
    bVar1 = true;
    if (dVar2 <= 0.9) {
      bVar1 = local_55;
    }
    if (bVar1) {
      *(undefined1 *)(in_RDI + 0x3c16f) = 1;
      *(bool *)(in_RDI + 0x3c170) = *(int *)(in_RDI + 0x9d1f4) != 0;
      *(undefined4 *)(in_RDI + 0x9d2f8) = 1;
      *(undefined4 *)(in_RDI + 0x9d2fc) = 1;
    }
    else {
      *(bool *)(in_RDI + 0x3c16f) = in_ESI != 0;
      *(bool *)(in_RDI + 0x3c170) = in_EDX != 0;
      *(undefined4 *)(in_RDI + 0x9d2f8) = in_ECX;
      *(undefined4 *)(in_RDI + 0x9d2fc) = in_R8D;
    }
  }
  return;
}

Assistant:

static void screen_content_tools_determination(
    AV1_COMP *cpi, const int allow_screen_content_tools_orig_decision,
    const int allow_intrabc_orig_decision,
    const int use_screen_content_tools_orig_decision,
    const int is_screen_content_type_orig_decision, const int pass,
    int *projected_size_pass, PSNR_STATS *psnr) {
  AV1_COMMON *const cm = &cpi->common;
  FeatureFlags *const features = &cm->features;

#if CONFIG_FPMT_TEST
  projected_size_pass[pass] =
      ((cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0) &&
       (cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE))
          ? cpi->ppi->p_rc.temp_projected_frame_size
          : cpi->rc.projected_frame_size;
#else
  projected_size_pass[pass] = cpi->rc.projected_frame_size;
#endif

#if CONFIG_AV1_HIGHBITDEPTH
  const uint32_t in_bit_depth = cpi->oxcf.input_cfg.input_bit_depth;
  const uint32_t bit_depth = cpi->td.mb.e_mbd.bd;
  aom_calc_highbd_psnr(cpi->source, &cpi->common.cur_frame->buf, &psnr[pass],
                       bit_depth, in_bit_depth);
#else
  aom_calc_psnr(cpi->source, &cpi->common.cur_frame->buf, &psnr[pass]);
#endif
  if (pass != 1) return;

  const double psnr_diff = psnr[1].psnr[0] - psnr[0].psnr[0];
  // Calculate % of palette mode to be chosen in a frame from mode decision.
  const double palette_ratio =
      (double)cpi->palette_pixel_num / (double)(cm->height * cm->width);
  const int psnr_diff_is_large = (psnr_diff > STRICT_PSNR_DIFF_THRESH);
  const int ratio_is_large =
      ((palette_ratio >= 0.0001) && ((psnr_diff / palette_ratio) > 4));
  const int is_sc_encoding_much_better = (psnr_diff_is_large || ratio_is_large);
  if (is_sc_encoding_much_better) {
    // Use screen content tools, if we get coding gain.
    features->allow_screen_content_tools = 1;
    features->allow_intrabc = cpi->intrabc_used;
    cpi->use_screen_content_tools = 1;
    cpi->is_screen_content_type = 1;
  } else {
    // Use original screen content decision.
    features->allow_screen_content_tools =
        allow_screen_content_tools_orig_decision;
    features->allow_intrabc = allow_intrabc_orig_decision;
    cpi->use_screen_content_tools = use_screen_content_tools_orig_decision;
    cpi->is_screen_content_type = is_screen_content_type_orig_decision;
  }
}